

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::
write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
          (buffer_appender<char> out,decimal_fp<double> *fp,basic_format_specs<char> *specs,
          float_specs fspecs,char decimal_point)

{
  int iVar1;
  size_t size;
  int iVar2;
  int iVar3;
  ulong uVar4;
  buffer_appender<char> bVar5;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> it;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  char cVar10;
  long lVar11;
  buffer<char> *buf;
  uint uVar12;
  ulong uVar13;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_85 [5];
  sign_t local_80;
  int local_7c;
  significand_type *******local_78;
  undefined1 local_6c [8];
  undefined4 uStack_64;
  significand_type *******local_60;
  undefined8 local_58;
  undefined8 local_50;
  float_specs *local_48;
  significand_type *******local_40;
  int *local_38;
  float_specs local_30;
  
  local_78 = (significand_type *******)fp->significand;
  local_7c = (uint)*(ushort *)
                    (bsr2log10(int)::data + (ulong)((uint)LZCOUNT((ulong)local_78 | 1) ^ 0x3f) * 2)
             - (uint)(local_78 <
                     *(significand_type ********)
                      (basic_data<void>::zero_or_powers_of_10_64_new +
                      (ulong)*(ushort *)
                              (bsr2log10(int)::data +
                              (ulong)((uint)LZCOUNT((ulong)local_78 | 1) ^ 0x3f) * 2) * 8));
  uVar8 = fspecs._4_4_;
  local_80 = uVar8 >> 8 & 0xff;
  local_85[0] = decimal_point;
  local_30 = fspecs;
  if (local_7c < 0) goto LAB_0011f653;
  iVar2 = fp->exponent;
  uVar7 = (local_7c + 1) - (uint)(local_80 == none);
  uVar9 = (ulong)uVar7;
  iVar1 = iVar2 + local_7c;
  uVar6 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_0011f320:
    iVar2 = iVar2 + -1 + local_7c;
    cVar10 = decimal_point;
    if ((uVar8 >> 0x14 & 1) == 0) {
      uVar6 = 0;
      if (local_7c == 1) {
        cVar10 = '\0';
      }
    }
    else {
      uVar6 = ~((int)(uVar6 - local_7c) >> 0x1f) & uVar6 - local_7c;
      uVar9 = (ulong)(uVar7 + uVar6);
    }
    stack0xffffffffffffff98 = (sign_t *)(CONCAT44(uStack_64,uVar8 >> 8) & 0xffffffff000000ff);
    local_58._0_5_ = CONCAT14(cVar10,local_7c);
    iVar3 = 1 - iVar1;
    if (0 < iVar1) {
      iVar3 = iVar2;
    }
    lVar11 = 2;
    if (99 < iVar3) {
      lVar11 = (ulong)(999 < iVar3) + 3;
    }
    uVar4 = (3 - (ulong)(cVar10 == '\0')) + uVar9 + lVar11;
    local_50 = (decimal_fp<double> *)
               (CONCAT35(local_50._5_3_,CONCAT14(((uVar8 >> 0x10 & 1) == 0) << 5,uVar6)) |
               0x4500000000);
    local_48 = (float_specs *)CONCAT44(local_48._4_4_,iVar2);
    uVar9 = (ulong)specs->width;
    local_60 = local_78;
    if ((long)uVar9 < 1) {
      if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                    + 0x18) <
          uVar4 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container + 0x10)) {
        (*(code *)**(undefined8 **)
                    out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                  (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      }
      bVar5 = write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
              ::anon_class_40_7_ef14d3db::operator()
                        ((anon_class_40_7_ef14d3db *)(local_6c + 4),
                         (iterator)
                         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
      return (buffer_appender<char>)
             bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar13 = 0;
    if (uVar4 <= uVar9) {
      uVar13 = uVar9 - uVar4;
    }
    cVar10 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                      (ulong)((byte)specs->field_0x9 & 0xf));
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                  0x18) <
        uVar4 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                container + 0x10) + (specs->fill).size_ * uVar13) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    }
    uVar9 = uVar13 >> ((long)cVar10 & 0x3fU);
    bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
    it.container = (buffer<char> *)
                   write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
                   ::anon_class_40_7_ef14d3db::operator()
                             ((anon_class_40_7_ef14d3db *)(local_6c + 4),
                              bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container);
    goto LAB_0011f568;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    uVar12 = 0x10;
    if (0 < (int)uVar6) {
      uVar12 = uVar6;
    }
    if ((iVar1 < -3) || ((int)uVar12 < iVar1)) goto LAB_0011f320;
  }
  local_6c._0_4_ = iVar1;
  if (iVar2 < 0) {
    if (0 < iVar1) {
      local_40 = (significand_type *******)(local_85 + 1);
      local_60 = (significand_type *******)&local_78;
      local_85._1_4_ = uVar6 - local_7c & (int)(uVar8 << 0xb) >> 0x1f;
      unique0x00004e80 = &local_80;
      size = (ulong)(uint)(~((int)local_85._1_4_ >> 0x1f) & local_85._1_4_) + 1 + uVar9;
      local_58 = &local_7c;
      local_50 = (decimal_fp<double> *)local_6c;
      local_48 = (float_specs *)local_85;
      bVar5 = write_padded<(fmt::v7::align::type)2,fmt::v7::detail::buffer_appender<char>,char,fmt::v7::detail::write_float<fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(fmt::v7::detail::buffer_appender<char>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(fmt::v7::detail::buffer_appender<char>)_3_&>
                        (out,specs,size,size,(anon_class_48_6_48d028d1 *)(local_6c + 4));
      return (buffer_appender<char>)
             bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
    }
    uVar8 = -iVar1;
    local_85._1_4_ = uVar8;
    if (SBORROW4(uVar6,uVar8) != (int)(uVar6 + iVar1) < 0) {
      local_85._1_4_ = uVar6;
    }
    if ((int)uVar6 < 0) {
      local_85._1_4_ = uVar8;
    }
    if (local_7c != 0) {
      local_85._1_4_ = uVar8;
    }
    if (-1 < (int)local_85._1_4_) {
      unique0x00004e80 = &local_80;
      local_60 = (significand_type *******)(local_85 + 1);
      local_58 = &local_7c;
      local_50 = (decimal_fp<double> *)&local_30;
      local_48 = (float_specs *)local_85;
      local_40 = (significand_type *******)&local_78;
      uVar4 = (ulong)specs->width;
      if (-1 < (long)uVar4) {
        uVar9 = (ulong)(uint)local_85._1_4_ + 2 + uVar9;
        uVar13 = 0;
        if (uVar9 <= uVar4) {
          uVar13 = uVar4 - uVar9;
        }
        cVar10 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                          (ulong)((byte)specs->field_0x9 & 0xf));
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                             container + 0x18) <
            uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                    container + 0x10) + (specs->fill).size_ * uVar13) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
        }
        uVar9 = uVar13 >> ((long)cVar10 & 0x3fU);
        bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
        it.container = (buffer<char> *)
                       write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
                       ::anon_class_48_6_9afe1116::operator()
                                 ((anon_class_48_6_9afe1116 *)(local_6c + 4),
                                  bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                                  container);
        goto LAB_0011f568;
      }
    }
    goto LAB_0011f653;
  }
  local_85._1_4_ = uVar6 - iVar1;
  uVar9 = (ulong)(iVar2 + uVar7);
  if ((uVar8 >> 0x14 & 1) != 0) {
    if ((fspecs._4_1_ == '\x02') || (0 < (int)local_85._1_4_)) {
      if ((int)local_85._1_4_ < 1) goto LAB_0011f4bd;
    }
    else {
      local_85._1_4_ = 1;
    }
    uVar9 = uVar9 + (uint)local_85._1_4_;
  }
LAB_0011f4bd:
  unique0x00004e80 = &local_80;
  local_60 = (significand_type *******)&local_78;
  local_58 = &local_7c;
  local_48 = &local_30;
  local_40 = (significand_type *******)local_85;
  local_38 = (int *)(local_85 + 1);
  uVar4 = (ulong)specs->width;
  local_50 = fp;
  if ((long)uVar4 < 0) {
LAB_0011f653:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/core.h"
                ,0x146,"negative value");
  }
  uVar13 = 0;
  if (uVar9 <= uVar4) {
    uVar13 = uVar4 - uVar9;
  }
  cVar10 = *(char *)((long)&basic_data<void>::right_padding_shifts +
                    (ulong)((byte)specs->field_0x9 & 0xf));
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      uVar9 + *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                              container + 0x10) + (specs->fill).size_ * uVar13) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar9 = uVar13 >> ((long)cVar10 & 0x3fU);
  bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,uVar9,&specs->fill);
  it.container = (buffer<char> *)
                 write_float<fmt::v7::detail::buffer_appender<char>,_fmt::v7::detail::dragonbox::decimal_fp<double>,_char>
                 ::anon_class_56_7_a2a26a24::operator()
                           ((anon_class_56_7_a2a26a24 *)(local_6c + 4),
                            bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container);
LAB_0011f568:
  bVar5 = fill<fmt::v7::detail::buffer_appender<char>,char>
                    ((buffer_appender<char>)it.container,uVar13 - uVar9,&specs->fill);
  return (buffer_appender<char>)
         bVar5.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}